

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int multipleBordersNearby(double latDeg,double lonDeg,Territory territory)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined *puVar10;
  Territory ccode;
  long lVar11;
  long lVar12;
  TerritoryBoundary local_54;
  long local_40;
  Point32 coord32;
  
  iVar6 = 0;
  if (territory != TERRITORY_AAA && _TERRITORY_MIN < territory) {
    if ((((uint)(territory + ~TERRITORY_AAA) < 0xfffffdeb) ||
        ((long)""[(uint)(territory + ~_TERRITORY_MIN)] == 0)) ||
       (iVar6 = multipleBordersNearby
                          (latDeg,lonDeg,PARENT_NR[""[(uint)(territory + ~_TERRITORY_MIN)]]),
       iVar6 == 0)) {
      iVar6 = DATA_START[(uint)(territory + ~_TERRITORY_MIN)];
      lVar11 = (long)DATA_START[(uint)(territory + 0xfffffc18)];
      convertCoordsToMicrosAndFractions(&coord32,(int *)0x0,(int *)0x0,latDeg,lonDeg);
      bVar4 = true;
      local_40 = (long)iVar6;
LAB_0016ae67:
      puVar10 = &UNK_001c246c + lVar11 * 0x14;
      lVar12 = local_40;
      do {
        if (lVar11 <= lVar12) {
          return 0;
        }
        if ((puVar10[1] & 2) == 0) {
          uVar1 = *(uint *)(puVar10 + -0xc);
          iVar6 = *(int *)(puVar10 + -4);
          uVar9 = uVar1;
          if ((int)uVar1 < 0) {
            iVar7 = 0x5a;
            if (iVar6 < 0) {
              uVar9 = -iVar6;
              goto LAB_0016ae9e;
            }
          }
          else {
LAB_0016ae9e:
            iVar7 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar9 >> 0x13) * 4) / 4;
          }
          local_54.miny = uVar1 - 0x3c;
          iVar2 = *(int *)(puVar10 + -0x10);
          iVar3 = *(int *)(puVar10 + -8);
          local_54.minx = iVar2 - iVar7;
          local_54.maxy = iVar6 + 0x3c;
          local_54.maxx = iVar7 + iVar3;
          iVar8 = fitsInsideBoundaries(&coord32,&local_54);
          lVar12 = local_40;
          if (iVar8 != 0) {
            local_54.miny = uVar1 + 0x3c;
            local_54.minx = iVar2 + iVar7;
            local_54.maxy = iVar6 + -0x3c;
            local_54.maxx = iVar3 - iVar7;
            iVar6 = fitsInsideBoundaries(&coord32,&local_54);
            lVar12 = local_40;
            if (iVar6 == 0) goto LAB_0016af64;
          }
        }
        puVar10 = puVar10 + -0x14;
        lVar11 = lVar11 + -1;
      } while( true );
    }
LAB_0016ae22:
    iVar6 = 1;
  }
  return iVar6;
LAB_0016af64:
  lVar11 = lVar11 + -1;
  bVar5 = !bVar4;
  bVar4 = false;
  if (bVar5) goto LAB_0016ae22;
  goto LAB_0016ae67;
}

Assistant:

int multipleBordersNearby(double latDeg, double lonDeg, enum Territory territory) {
    const enum Territory ccode = territory;
    if ((ccode > _TERRITORY_MIN) && (ccode != TERRITORY_AAA)) { // valid territory, not earth
        const enum Territory parentTerritoryCode = getParentCountryOf(territory);
        if (parentTerritoryCode != TERRITORY_NONE) {
            // there is a parent! check its borders as well...
            if (multipleBordersNearby(latDeg, lonDeg, parentTerritoryCode)) {
                return 1;
            }
        }
        {
            int m;
            int nrFound = 0;
            const int from = firstRec(ccode);
            const int upto = lastRec(ccode);
            Point32 coord32;
            convertCoordsToMicrosAndFractions(&coord32, NULL, NULL, latDeg, lonDeg);
            for (m = upto; m >= from; m--) {
                if (!IS_RESTRICTED(m)) {
                    if (isNearBorderOf(&coord32, TERRITORY_BOUNDARY(m))) {
                        nrFound++;
                        if (nrFound > 1) {
                            return 1;
                        }
                    }
                }
            }
        }
    }
    return 0;
}